

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.c
# Opt level: O2

int worker_init(worker_handle *wh)

{
  int iVar1;
  condvar_handle *condvar;
  
  condvar = (condvar_handle *)wh->priv;
  if (condvar == (condvar_handle *)0x0) {
    condvar = (condvar_handle *)calloc(1,0x40);
    if (condvar == (condvar_handle *)0x0) {
      return -0xc;
    }
    wh->priv = condvar;
  }
  iVar1 = condvar_init(condvar);
  if (((-1 < iVar1) && (iVar1 = condvar_init(condvar + 1), -1 < iVar1)) &&
     (iVar1 = mutex_init((mutex_handle *)(condvar + 2)), -1 < iVar1)) {
    condvar[5].priv = wh;
    condvar[4].priv = worker_func;
    *(uint *)&condvar[6].priv = wh->stack_size;
    iVar1 = thread_init((thread_handle *)(condvar + 3));
    if (-1 < iVar1) {
      return 0;
    }
  }
  mutex_free((mutex_handle *)(condvar + 2));
  condvar_free(condvar + 1);
  condvar_free(condvar);
  free(wh->priv);
  wh->priv = (void *)0x0;
  return iVar1;
}

Assistant:

int worker_init(struct worker_handle *wh)
{
	struct worker_priv *priv = wh->priv;
	int ret;

	if (priv == NULL) {
		priv = calloc(1, sizeof(*priv));
		if (priv == NULL)
			return -ENOMEM;

		wh->priv = priv;
	}

	ret = condvar_init(&priv->condvar);
	if (ret < 0)
		goto worker_init_exit;

	ret = condvar_init(&priv->condvar_idle);
	if (ret < 0)
		goto worker_init_exit;

	ret = mutex_init(&priv->mutex);
	if (ret < 0)
		goto worker_init_exit;

	priv->thread.func_ctx = wh;
	priv->thread.func_ptr = worker_func;
	priv->thread.stack_size = wh->stack_size;
	ret = thread_init(&priv->thread);
	if (ret < 0)
		goto worker_init_exit;

	return 0;

worker_init_exit:
	mutex_free(&priv->mutex);

	condvar_free(&priv->condvar_idle);
	condvar_free(&priv->condvar);

	free(wh->priv);
	wh->priv = NULL;

	return ret;
}